

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::StringOneofFieldGenerator
          (StringOneofFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  string *psVar1;
  mapped_type *pmVar2;
  OneofDescriptor *this_00;
  char *pcVar3;
  int __c;
  AlphaNum *a;
  allocator local_e9;
  key_type local_e8;
  AlphaNum local_c8;
  string local_98;
  allocator local_71;
  key_type local_70;
  string local_50;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  StringOneofFieldGenerator *this_local;
  
  local_20 = options;
  options_local = (Options *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  StringFieldGenerator::StringFieldGenerator(&this->super_StringFieldGenerator,descriptor,options);
  (this->super_StringFieldGenerator).super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__StringOneofFieldGenerator_008e7b98;
  SetCommonOneofFieldVariables
            ((FieldDescriptor *)options_local,
             &(this->super_StringFieldGenerator).super_FieldGenerator.variables_);
  psVar1 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)options_local);
  UnderscoresToCamelCase(&local_50,psVar1,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"field_name",&local_71);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_StringFieldGenerator).super_FieldGenerator.variables_,
                        &local_70);
  psVar1 = &local_50;
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = FieldDescriptor::containing_oneof((FieldDescriptor *)options_local);
  pcVar3 = OneofDescriptor::index(this_00,(char *)psVar1,__c);
  strings::AlphaNum::AlphaNum(&local_c8,(int)pcVar3);
  StrCat_abi_cxx11_(&local_98,(protobuf *)&local_c8,a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"oneof_index",&local_e9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_StringFieldGenerator).super_FieldGenerator.variables_,
                        &local_e8);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

StringOneofFieldGenerator::StringOneofFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : StringFieldGenerator(descriptor, options) {
  SetCommonOneofFieldVariables(descriptor, &variables_);
  variables_["field_name"] = UnderscoresToCamelCase(descriptor->name(), true);
  variables_["oneof_index"] =
      StrCat(descriptor->containing_oneof()->index());
}